

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Number __thiscall
chaiscript::Boxed_Number::bitwise_complement(Boxed_Number *this,Boxed_Number *t_lhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Number BVar2;
  Boxed_Number local_50;
  Object_Data local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  anon_class_24_3_1b4046b4 local_30;
  
  Boxed_Value::Object_Data::get<int>(local_40,0,false);
  local_30.t_oper = bitwise_complement;
  local_30.t_lhs = &t_lhs->bv;
  local_30.t_rhs = (Boxed_Value *)local_40;
  visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
            (&local_50,&t_lhs->bv,&local_30);
  Boxed_Number(this,&local_50.bv);
  _Var1._M_pi = extraout_RDX;
  if (local_50.bv.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.bv.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var1._M_pi = extraout_RDX_01;
  }
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar2.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static const Boxed_Number bitwise_complement(const Boxed_Number &t_lhs) {
      return Boxed_Number(oper(Operators::Opers::bitwise_complement, t_lhs.bv, Boxed_Value(0)));
    }